

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.cpp
# Opt level: O3

void __thiscall OpenMD::Torsion::calcForce(Torsion *this,RealType *angle,bool doParticlePot)

{
  double *pdVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  Snapshot *pSVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  DataStoragePointer DVar9;
  Snapshot *pSVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint i;
  long lVar17;
  long lVar18;
  uint i_22;
  uint i_24;
  long lVar19;
  uint i_23;
  uint i_21;
  uint i_20;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined4 uVar23;
  double tmp;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double tmp_1;
  Vector<double,_3U> result_7;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_1;
  Vector3<double> result_4;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  RealType dVdcosPhi;
  Vector<double,_3U> result_20;
  Vector<double,_3U> result_19;
  Vector3<double> result_14;
  double local_288 [4];
  undefined1 local_268 [16];
  double local_258;
  double local_250;
  double local_248 [4];
  Vector3d local_228;
  double local_208 [4];
  Vector3d local_1e8;
  double local_1c8 [4];
  double local_1a8 [4];
  double local_188 [4];
  double local_168 [4];
  RealType *local_148;
  double local_140;
  double local_138;
  double local_130;
  Vector3d local_128;
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [3];
  
  ppAVar2 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar3 = *ppAVar2;
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_48[0] = *pdVar1;
  local_48[1] = pdVar1[1];
  pAVar3 = ppAVar2[1];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_a8[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_a8[0] = *pdVar1;
  local_a8[1] = pdVar1[1];
  pAVar3 = ppAVar2[2];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_c8[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_c8[0] = *pdVar1;
  local_c8[1] = pdVar1[1];
  pAVar3 = ppAVar2[3];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_68[0] = *pdVar1;
  local_68[1] = pdVar1[1];
  local_228.super_Vector<double,_3U>.data_[0] = 0.0;
  local_228.super_Vector<double,_3U>.data_[1] = 0.0;
  local_228.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar17 = 0;
  do {
    local_228.super_Vector<double,_3U>.data_[lVar17] = local_48[lVar17] - local_a8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_128.super_Vector<double,_3U>.data_[2] = local_228.super_Vector<double,_3U>.data_[2];
  local_128.super_Vector<double,_3U>.data_[0] = local_228.super_Vector<double,_3U>.data_[0];
  local_128.super_Vector<double,_3U>.data_[1] = local_228.super_Vector<double,_3U>.data_[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_128);
  local_1e8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1e8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1e8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar17 = 0;
  do {
    local_1e8.super_Vector<double,_3U>.data_[lVar17] = local_a8[lVar17] - local_c8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_228.super_Vector<double,_3U>.data_[2] = local_1e8.super_Vector<double,_3U>.data_[2];
  local_228.super_Vector<double,_3U>.data_[0] = local_1e8.super_Vector<double,_3U>.data_[0];
  local_228.super_Vector<double,_3U>.data_[1] = local_1e8.super_Vector<double,_3U>.data_[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_228);
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_248[2] = 0.0;
  lVar17 = 0;
  do {
    local_248[lVar17] = local_c8[lVar17] - local_68[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_1e8.super_Vector<double,_3U>.data_[2] = local_248[2];
  local_1e8.super_Vector<double,_3U>.data_[0] = local_248[0];
  local_1e8.super_Vector<double,_3U>.data_[1] = local_248[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_1e8);
  local_248[0] = local_228.super_Vector<double,_3U>.data_[2] *
                 local_128.super_Vector<double,_3U>.data_[1] -
                 local_128.super_Vector<double,_3U>.data_[2] *
                 local_228.super_Vector<double,_3U>.data_[1];
  local_248[1] = local_228.super_Vector<double,_3U>.data_[0] *
                 local_128.super_Vector<double,_3U>.data_[2] -
                 local_128.super_Vector<double,_3U>.data_[0] *
                 local_228.super_Vector<double,_3U>.data_[2];
  local_248[2] = local_128.super_Vector<double,_3U>.data_[0] *
                 local_228.super_Vector<double,_3U>.data_[1] -
                 local_228.super_Vector<double,_3U>.data_[0] *
                 local_128.super_Vector<double,_3U>.data_[1];
  local_250 = 0.0;
  lVar17 = 0;
  do {
    local_250 = local_250 + local_248[lVar17] * local_248[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (local_250 < 0.0) {
    local_250 = sqrt(local_250);
  }
  else {
    local_250 = SQRT(local_250);
  }
  local_138 = 0.0;
  local_1c8[0] = local_1e8.super_Vector<double,_3U>.data_[2] *
                 local_228.super_Vector<double,_3U>.data_[1] -
                 local_228.super_Vector<double,_3U>.data_[2] *
                 local_1e8.super_Vector<double,_3U>.data_[1];
  local_1c8[1] = local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_228.super_Vector<double,_3U>.data_[2] -
                 local_228.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[2];
  local_1c8[2] = local_228.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[1] -
                 local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_228.super_Vector<double,_3U>.data_[1];
  lVar17 = 0;
  do {
    local_138 = local_138 + local_1c8[lVar17] * local_1c8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (local_138 < 0.0) {
    local_138 = sqrt(local_138);
  }
  else {
    local_138 = SQRT(local_138);
  }
  if (1e-06 <= local_250 * local_138) {
    dVar11 = 0.0;
    lVar17 = 0;
    do {
      dVar11 = dVar11 + local_248[lVar17] * local_248[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar17 = 0;
    do {
      local_248[lVar17] = local_248[lVar17] / dVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dVar11 = 0.0;
    lVar17 = 0;
    do {
      dVar11 = dVar11 + local_1c8[lVar17] * local_1c8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar17 = 0;
    do {
      local_1c8[lVar17] = local_1c8[lVar17] / dVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dVar11 = 0.0;
    lVar17 = 0;
    do {
      dVar11 = dVar11 + local_248[lVar17] * local_1c8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    uVar25 = 0;
    uVar26 = 0x3ff00000;
    if (dVar11 <= 1.0) {
      uVar25 = SUB84(dVar11,0);
      uVar26 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    uVar23 = 0;
    uVar24 = 0xbff00000;
    if (-1.0 <= (double)CONCAT44(uVar26,uVar25)) {
      uVar23 = uVar25;
      uVar24 = uVar26;
    }
    local_140 = (double)CONCAT44(uVar24,uVar23);
    local_148 = &this->potential_;
    (*this->torsionType_->_vptr_TorsionType[2])(this->torsionType_,local_148,&local_130);
    lVar17 = 0;
    local_168[2] = 0.0;
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_188[2] = 0.0;
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[2] = 0.0;
    local_208[2] = 0.0;
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    do {
      local_208[lVar17] = local_248[lVar17] * local_140;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_268 = ZEXT816(0);
    local_258 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_268 + lVar17 * 8) = local_208[lVar17] - local_1c8[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_288[2] = 0.0;
    lVar17 = 0;
    do {
      local_288[lVar17] = *(double *)(local_268 + lVar17 * 8) / local_250;
      dVar15 = local_288[2];
      dVar13 = local_288[1];
      dVar11 = local_288[0];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    local_208[2] = 0.0;
    lVar17 = 0;
    do {
      local_208[lVar17] = local_1c8[lVar17] * local_140;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_268 = ZEXT816(0);
    local_258 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_268 + lVar17 * 8) = local_208[lVar17] - local_248[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_288[2] = 0.0;
    lVar17 = 0;
    do {
      local_288[lVar17] = *(double *)(local_268 + lVar17 * 8) / local_138;
      dVar16 = local_288[2];
      dVar14 = local_288[1];
      dVar12 = local_288[0];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_268._0_8_ =
         local_228.super_Vector<double,_3U>.data_[1] * dVar15 -
         dVar13 * local_228.super_Vector<double,_3U>.data_[2];
    local_268._8_8_ =
         local_228.super_Vector<double,_3U>.data_[2] * dVar11 -
         dVar15 * local_228.super_Vector<double,_3U>.data_[0];
    local_258 = local_228.super_Vector<double,_3U>.data_[0] * dVar13 -
                dVar11 * local_228.super_Vector<double,_3U>.data_[1];
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_288[2] = 0.0;
    lVar17 = 0;
    do {
      local_288[lVar17] = *(double *)(local_268 + lVar17 * 8) * local_130;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_168[2] = local_288[2];
    local_168[0] = local_288[0];
    local_168[1] = local_288[1];
    local_208[0] = local_1e8.super_Vector<double,_3U>.data_[1] * dVar16 -
                   local_1e8.super_Vector<double,_3U>.data_[2] * dVar14;
    local_208[1] = local_1e8.super_Vector<double,_3U>.data_[2] * dVar12 -
                   local_1e8.super_Vector<double,_3U>.data_[0] * dVar16;
    local_208[2] = local_1e8.super_Vector<double,_3U>.data_[0] * dVar14 -
                   dVar12 * local_1e8.super_Vector<double,_3U>.data_[1];
    local_88[0] = dVar15 * local_128.super_Vector<double,_3U>.data_[1] -
                  dVar13 * local_128.super_Vector<double,_3U>.data_[2];
    local_88[1] = dVar11 * local_128.super_Vector<double,_3U>.data_[2] -
                  dVar15 * local_128.super_Vector<double,_3U>.data_[0];
    local_88[2] = dVar13 * local_128.super_Vector<double,_3U>.data_[0] -
                  dVar11 * local_128.super_Vector<double,_3U>.data_[1];
    local_268 = ZEXT816(0);
    local_258 = 0.0;
    lVar17 = 0;
    do {
      *(double *)(local_268 + lVar17 * 8) = local_208[lVar17] - local_88[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_288[2] = 0.0;
    lVar17 = 0;
    do {
      local_288[lVar17] = *(double *)(local_268 + lVar17 * 8) * local_130;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_188[2] = local_288[2];
    local_188[0] = local_288[0];
    local_188[1] = local_288[1];
    dVar11 = dVar16 * local_228.super_Vector<double,_3U>.data_[0] -
             local_228.super_Vector<double,_3U>.data_[2] * dVar12;
    local_268._8_4_ = SUB84(dVar11,0);
    local_268._0_8_ =
         dVar14 * local_228.super_Vector<double,_3U>.data_[2] -
         local_228.super_Vector<double,_3U>.data_[1] * dVar16;
    local_268._12_4_ = (int)((ulong)dVar11 >> 0x20);
    local_258 = dVar12 * local_228.super_Vector<double,_3U>.data_[1] -
                local_228.super_Vector<double,_3U>.data_[0] * dVar14;
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_288[2] = 0.0;
    lVar17 = 0;
    do {
      local_288[lVar17] = *(double *)(local_268 + lVar17 * 8) * local_130;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    local_1a8[2] = local_288[2];
    local_1a8[0] = local_288[0];
    local_1a8[1] = local_288[1];
    ppAVar2 = (this->super_ShortRangeInteraction).atoms_.
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar3 = *ppAVar2;
    local_250 = (double)(pAVar3->super_StuntDouble).storage_;
    pSVar4 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar17 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar18 = lVar17 * 0x18 +
             *(long *)((long)&(pSVar4->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)local_250);
    lVar19 = 0;
    do {
      *(double *)(lVar18 + lVar19 * 8) = local_168[lVar19] + *(double *)(lVar18 + lVar19 * 8);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    pAVar3 = ppAVar2[1];
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    lVar18 = 0;
    do {
      local_e8[lVar18] = local_188[lVar18] - local_168[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    DVar5 = (pAVar3->super_StuntDouble).storage_;
    pSVar6 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar19 = lVar18 * 0x18 +
             *(long *)((long)&(pSVar6->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar5);
    lVar20 = 0;
    do {
      *(double *)(lVar19 + lVar20 * 8) = local_e8[lVar20] + *(double *)(lVar19 + lVar20 * 8);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    pAVar3 = ppAVar2[2];
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_108[2] = 0.0;
    lVar19 = 0;
    do {
      local_108[lVar19] = local_1a8[lVar19] - local_188[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    DVar7 = (pAVar3->super_StuntDouble).storage_;
    pSVar8 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar20 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar21 = lVar20 * 0x18 +
             *(long *)((long)&(pSVar8->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar7);
    lVar19 = 0;
    do {
      *(double *)(lVar21 + lVar19 * 8) = local_108[lVar19] + *(double *)(lVar21 + lVar19 * 8);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    pAVar3 = ppAVar2[3];
    lVar19 = 0;
    do {
      local_1a8[lVar19] = -local_1a8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    DVar9 = (pAVar3->super_StuntDouble).storage_;
    pSVar10 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar22 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar19 = lVar22 * 0x18 +
             *(long *)((long)&(pSVar10->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar9);
    lVar21 = 0;
    do {
      *(double *)(lVar19 + lVar21 * 8) = local_1a8[lVar21] + *(double *)(lVar19 + lVar21 * 8);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    if (doParticlePot) {
      lVar19 = *(long *)((long)&(pSVar4->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)local_250);
      *(double *)(lVar19 + lVar17 * 8) = *local_148 + *(double *)(lVar19 + lVar17 * 8);
      lVar17 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar5);
      *(double *)(lVar17 + lVar18 * 8) = *local_148 + *(double *)(lVar17 + lVar18 * 8);
      lVar17 = *(long *)((long)&(pSVar8->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar7);
      *(double *)(lVar17 + lVar20 * 8) = *local_148 + *(double *)(lVar17 + lVar20 * 8);
      lVar17 = *(long *)((long)&(pSVar10->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar9);
      *(double *)(lVar17 + lVar22 * 8) = *local_148 + *(double *)(lVar17 + lVar22 * 8);
    }
    dVar11 = acos(local_140);
    *angle = (dVar11 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void Torsion::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);
    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r32, dcosdA);
    f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);
    atoms_[2]->addFrc(f3 - f2);
    atoms_[3]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }